

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O2

int ON_wString::ScanBufferVargs(wchar_t *buffer,wchar_t *format,__va_list_tag *args)

{
  int iVar1;
  
  if (format == (wchar_t *)0x0 || buffer == (wchar_t *)0x0) {
    return -1;
  }
  iVar1 = __isoc99_swscanf();
  return iVar1;
}

Assistant:

int ON_wString::ScanBufferVargs(
  const wchar_t* buffer,
  const wchar_t* format,
  va_list args
  )
{
  if (nullptr == buffer || nullptr == format)
    return -1;
  
#if defined(ON_RUNTIME_WIN)
  if (nullptr == args)
    return -1;
  return _vswscanf_s_l(buffer, format, ON_Locale::InvariantCulture.NumericLocalePtr(), args);
#elif defined(ON_RUNTIME_APPLE)
  if (nullptr == args)
    return -1;
  return swscanf_l(buffer, _c_locale, format, args);
#elif defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  return swscanf(buffer, format, args);
#else
  return swscanf(buffer, format, args);
#endif
}